

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

QString * __thiscall QCss::Symbol::lexem(QString *__return_storage_ptr__,Symbol *this)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  Data *pDVar3;
  int iVar4;
  int iVar5;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (0 < this->len) {
    QString::reallocData((longlong)__return_storage_ptr__,this->len);
    pDVar3 = (__return_storage_ptr__->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    iVar4 = this->len;
    if (0 < iVar4) {
      iVar5 = 0;
      do {
        cVar2 = (this->text).d.ptr[this->start + iVar5];
        QString::append((QChar)(char16_t)__return_storage_ptr__);
        iVar5 = iVar5 + (uint)(iVar5 < iVar4 + -1 && cVar2 == L'\\') + 1;
        iVar4 = this->len;
      } while (iVar5 < iVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString Symbol::lexem() const
{
    QString result;
    if (len > 0)
        result.reserve(len);
    for (int i = 0; i < len; ++i) {
        if (text.at(start + i) == u'\\' && i < len - 1)
            ++i;
        result += text.at(start + i);
    }
    return result;
}